

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

JSON * chaiscript::json::JSONParser::parse_array
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  const_reference pvVar1;
  JSON *this;
  runtime_error *this_00;
  size_t sVar2;
  size_t index;
  allocator<char> local_99;
  _Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
  local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  JSON::Internal::make_type_abi_cxx11_((Data *)__return_storage_ptr__,(Internal *)0x2,(Class)offset)
  ;
  *offset = *offset + 1;
  consume_ws(str,offset);
  pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     (str,*offset);
  if (*pvVar1 == ']') {
LAB_003af490:
    *offset = *offset + 1;
  }
  else {
    sVar2 = *offset;
    index = 0;
    while (sVar2 < str->_M_string_length) {
      parse_next((JSON *)&local_98,str,offset);
      this = JSON::operator[](__return_storage_ptr__,index);
      std::__detail::__variant::
      _Move_assign_base<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
      ::operator=((_Move_assign_base<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
                   *)this,(_Move_assign_base<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
                           *)&local_98);
      std::__detail::__variant::
      _Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
      ::~_Variant_storage(&local_98);
      consume_ws(str,offset);
      pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                         (str,*offset);
      if (*pvVar1 != ',') {
        pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                           (str,*offset);
        if (*pvVar1 != ']') {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"JSON ERROR: Array: Expected \',\' or \']\', found \'",
                     &local_99);
          pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   at(str,*offset);
          std::operator+(&local_50,&local_70,*pvVar1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_98,&local_50,"\'\n");
          std::runtime_error::runtime_error(this_00,(string *)&local_98);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_003af490;
      }
      sVar2 = *offset + 1;
      *offset = sVar2;
      index = index + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static JSON parse_array(const std::string &str, size_t &offset) {
      JSON Array(JSON::Class::Array);
      size_t index = 0;

      ++offset;
      consume_ws(str, offset);
      if (str.at(offset) == ']') {
        ++offset;
        return Array;
      }

      for (; offset < str.size();) {
        Array[index++] = parse_next(str, offset);
        consume_ws(str, offset);

        if (str.at(offset) == ',') {
          ++offset;
          continue;
        } else if (str.at(offset) == ']') {
          ++offset;
          break;
        } else {
          throw std::runtime_error(std::string("JSON ERROR: Array: Expected ',' or ']', found '") + str.at(offset) + "'\n");
        }
      }

      return Array;
    }